

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

Bool prvTidySetOptionBool(TidyDocImpl *doc,TidyOptionId optId,Bool val)

{
  TidyConfigChangeCallback p_Var1;
  ulong uVar2;
  ulong uVar3;
  
  if (optId < N_TIDY_OPTIONS) {
    if (option_defs[optId].type != TidyBoolean) {
      __assert_fail("option_defs[ optId ].type == TidyBoolean",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/config.c"
                    ,499,"Bool prvTidySetOptionBool(TidyDocImpl *, TidyOptionId, Bool)");
    }
    uVar3 = (ulong)val;
    p_Var1 = doc->pConfigChangeCallback;
    if (p_Var1 == (TidyConfigChangeCallback)0x0) {
      (doc->config).value[optId].v = uVar3;
    }
    else {
      uVar2 = (doc->config).value[optId].v;
      (doc->config).value[optId].v = uVar3;
      if (uVar2 != uVar3) {
        (*p_Var1)((TidyDoc)doc,(TidyOption)(option_defs + optId));
      }
    }
  }
  return (Bool)(optId < N_TIDY_OPTIONS);
}

Assistant:

Bool TY_(SetOptionBool)( TidyDocImpl* doc, TidyOptionId optId, Bool val )
{
    Bool status = ( optId < N_TIDY_OPTIONS );
    if ( status )
    {
        assert( option_defs[ optId ].type == TidyBoolean );
        SetOptionInteger( doc, optId, (ulong)val );
    }
    return status;
}